

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Point::SubEntities(Point *this,uint rel_codim)

{
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  Point *pPStack_20;
  uint rel_codim_local;
  Point *this_local;
  
  local_24 = rel_codim;
  pPStack_20 = this;
  if (rel_codim != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"A point has only codim = 0 sub-entities");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"rel_codim == 0",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x46,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x46,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::span<lf::mesh::Entity_*const_*>
            ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&this_local,&this->this_
             ,1);
  return _this_local;
}

Assistant:

[[nodiscard]] std::span<const Entity* const> SubEntities(
      unsigned rel_codim) const override {
    LF_ASSERT_MSG(rel_codim == 0, "A point has only codim = 0 sub-entities");
    return {&this_, 1};
  }